

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarPrintCone(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ManRegNum(p);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pMan) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                    ,0xfb0,"int Abc_NtkDarPrintCone(Abc_Ntk_t *)");
    }
    Saig_ManPrintCones(p);
    Aig_ManStop(p);
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarPrintCone( Abc_Ntk_t * pNtk )
{
    extern void Saig_ManPrintCones( Aig_Man_t * pAig );
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return 0;
    assert( Aig_ManRegNum(pMan) > 0 );
    Saig_ManPrintCones( pMan );
    Aig_ManStop( pMan );
    return 1;
}